

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O3

btScalar __thiscall btLCP::AiN_times_qN(btLCP *this,int i,btScalar *q)

{
  uint uVar1;
  float *pfVar2;
  float *pfVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  
  pfVar2 = this->m_A[i] + this->m_nC;
  pfVar3 = q + this->m_nC;
  uVar1 = this->m_nN;
  uVar4 = uVar1 - 2;
  fVar6 = 0.0;
  uVar5 = uVar1;
  if (1 < (int)uVar1) {
    do {
      fVar6 = pfVar2[1] * pfVar3[1] + *pfVar2 * *pfVar3 + fVar6;
      pfVar2 = pfVar2 + 2;
      pfVar3 = pfVar3 + 2;
      uVar5 = uVar5 - 2;
    } while (1 < uVar5);
    uVar4 = (uVar1 - (uVar4 & 0xfffffffe)) - 4;
  }
  if (uVar4 == 0xffffffff) {
    return *pfVar2 * *pfVar3 + fVar6;
  }
  return fVar6;
}

Assistant:

btScalar AiN_times_qN (int i, btScalar *q) const { return btLargeDot (BTAROW(i)+m_nC, q+m_nC, m_nN); }